

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::postsolve(Highs *this,HighsSolution *solution,HighsBasis *basis)

{
  uint uVar1;
  HighsStatus HVar2;
  string local_30;
  
  uVar1 = this->model_presolve_status_ + kInfeasible;
  if ((uVar1 < 0xb) && ((0x473U >> (uVar1 & 0x1f) & 1) != 0)) {
    HVar2 = callRunPostsolve(this,solution,basis);
    HVar2 = returnFromHighs(this,HVar2);
    return HVar2;
  }
  presolveStatusToString_abi_cxx11_(&local_30,(Highs *)solution,this->model_presolve_status_);
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kWarning,
               "Cannot run postsolve with presolve status: %s\n",local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return kWarning;
}

Assistant:

HighsStatus Highs::postsolve(const HighsSolution& solution,
                             const HighsBasis& basis) {
  const bool can_run_postsolve =
      model_presolve_status_ == HighsPresolveStatus::kNotPresolved ||
      model_presolve_status_ == HighsPresolveStatus::kNotReduced ||
      model_presolve_status_ == HighsPresolveStatus::kReduced ||
      model_presolve_status_ == HighsPresolveStatus::kReducedToEmpty ||
      model_presolve_status_ == HighsPresolveStatus::kTimeout ||
      model_presolve_status_ == HighsPresolveStatus::kOutOfMemory;
  if (!can_run_postsolve) {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "Cannot run postsolve with presolve status: %s\n",
                 presolveStatusToString(model_presolve_status_).c_str());
    return HighsStatus::kWarning;
  }
  HighsStatus return_status = callRunPostsolve(solution, basis);
  return returnFromHighs(return_status);
}